

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::InsertMoveForPolymorphicCacheIndex
          (Lowerer *this,Instr *instr,BailOutInfo *bailOutInfo,int bailOutRecordOffset,
          uint polymorphicCacheIndexValue)

{
  MemRefOpnd *dst;
  IntConstOpnd *src;
  
  dst = IR::MemRefOpnd::New(&bailOutInfo->bailOutRecord->polymorphicCacheIndex,TyUint32,this->m_func
                            ,AddrOpndKindDynamicMisc);
  src = IR::IntConstOpnd::New((ulong)polymorphicCacheIndexValue,TyUint32,this->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,false);
  return;
}

Assistant:

void Lowerer::InsertMoveForPolymorphicCacheIndex(IR::Instr * instr, BailOutInfo * bailOutInfo, int bailOutRecordOffset, uint polymorphicCacheIndexValue)
{
    IR::Opnd * indexOpnd = nullptr;

    if (this->m_func->IsOOPJIT())
    {
        indexOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + BailOutRecord::GetOffsetOfPolymorphicCacheIndex()), TyUint32, m_func);
    }
    else
    {
        indexOpnd = IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + BailOutRecord::GetOffsetOfPolymorphicCacheIndex(), TyUint32, this->m_func);
    }

    InsertMove(
        indexOpnd, IR::IntConstOpnd::New(polymorphicCacheIndexValue, TyUint32, this->m_func), instr, false);
}